

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

bool GUIComponentLoad(string *path,
                     vector<GUIComponent,_std::allocator<GUIComponent>_> *out_components)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  float local_4a4;
  float local_4a0;
  float w_1;
  float z_3;
  float y_4;
  float x_4;
  float z_2;
  float y_3;
  float x_3;
  float w;
  float z_1;
  float y_2;
  float x_2;
  float z;
  float y_1;
  float x_1;
  float y;
  float x;
  float value;
  GUIComponent comp;
  string type;
  string uniformName;
  istringstream iss;
  string local_258 [8];
  string line;
  istream local_228 [8];
  ifstream file;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *out_components_local;
  string *path_local;
  
  std::ifstream::ifstream(local_228,path,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    path_local._7_1_ = false;
    line.field_2._8_4_ = 1;
  }
  else {
    std::__cxx11::string::string(local_258);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_228,local_258);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      std::__cxx11::istringstream::istringstream
                ((istringstream *)((long)&uniformName.field_2 + 8),local_258,8);
      std::__cxx11::string::string((string *)(type.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(comp.Data + 3));
      piVar3 = std::operator>>((istream *)(uniformName.field_2._M_local_buf + 8),
                               (string *)(type.field_2._M_local_buf + 8));
      std::operator>>(piVar3,(string *)(comp.Data + 3));
      GUIComponent::GUIComponent((GUIComponent *)&x);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (comp.Data + 3),"s1");
      if (bVar2) {
        std::istream::operator>>((istream *)(uniformName.field_2._M_local_buf + 8),&y);
        x = 0.0;
        std::__cxx11::string::operator=((string *)&comp,(string *)(type.field_2._M_local_buf + 8));
        comp.field_4.SliderRange.Start = y;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(comp.Data + 3),"s2");
        if (bVar2) {
          piVar3 = (istream *)
                   std::istream::operator>>((istream *)(uniformName.field_2._M_local_buf + 8),&x_1);
          std::istream::operator>>(piVar3,&y_1);
          x = 1.4013e-45;
          std::__cxx11::string::operator=((string *)&comp,(string *)(type.field_2._M_local_buf + 8))
          ;
          comp.field_4.SliderRange.Start = x_1;
          comp.field_4.SliderRange.End = y_1;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(comp.Data + 3),"s3");
          if (bVar2) {
            piVar3 = (istream *)
                     std::istream::operator>>((istream *)(uniformName.field_2._M_local_buf + 8),&z);
            piVar3 = (istream *)std::istream::operator>>(piVar3,&x_2);
            std::istream::operator>>(piVar3,&y_2);
            x = 2.8026e-45;
            std::__cxx11::string::operator=
                      ((string *)&comp,(string *)(type.field_2._M_local_buf + 8));
            comp.field_4.SliderRange.Start = z;
            comp.field_4.SliderRange.End = x_2;
            comp.Data[0] = y_2;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(comp.Data + 3),"s4");
            if (bVar2) {
              piVar3 = (istream *)
                       std::istream::operator>>
                                 ((istream *)(uniformName.field_2._M_local_buf + 8),&z_1);
              piVar3 = (istream *)std::istream::operator>>(piVar3,&w);
              piVar3 = (istream *)std::istream::operator>>(piVar3,&x_3);
              std::istream::operator>>(piVar3,&y_3);
              x = 4.2039e-45;
              std::__cxx11::string::operator=
                        ((string *)&comp,(string *)(type.field_2._M_local_buf + 8));
              comp.field_4.SliderRange.Start = z_1;
              comp.field_4.SliderRange.End = w;
              comp.Data[0] = x_3;
              comp.Data[1] = y_3;
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(comp.Data + 3),"c3");
              if (bVar2) {
                piVar3 = (istream *)
                         std::istream::operator>>
                                   ((istream *)(uniformName.field_2._M_local_buf + 8),&z_2);
                piVar3 = (istream *)std::istream::operator>>(piVar3,&x_4);
                std::istream::operator>>(piVar3,&y_4);
                x = 5.60519e-45;
                std::__cxx11::string::operator=
                          ((string *)&comp,(string *)(type.field_2._M_local_buf + 8));
                comp.field_4.SliderRange.Start = z_2;
                comp.field_4.SliderRange.End = x_4;
                comp.Data[0] = y_4;
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(comp.Data + 3),"c4");
                if (bVar2) {
                  piVar3 = (istream *)
                           std::istream::operator>>
                                     ((istream *)(uniformName.field_2._M_local_buf + 8),&z_3);
                  piVar3 = (istream *)std::istream::operator>>(piVar3,&w_1);
                  piVar3 = (istream *)std::istream::operator>>(piVar3,&local_4a0);
                  std::istream::operator>>(piVar3,&local_4a4);
                  x = 7.00649e-45;
                  std::__cxx11::string::operator=
                            ((string *)&comp,(string *)(type.field_2._M_local_buf + 8));
                  comp.field_4.SliderRange.Start = z_3;
                  comp.field_4.SliderRange.End = w_1;
                  comp.Data[0] = local_4a0;
                  comp.Data[1] = local_4a4;
                }
              }
            }
          }
        }
      }
      std::vector<GUIComponent,_std::allocator<GUIComponent>_>::push_back
                (out_components,(value_type *)&x);
      GUIComponent::~GUIComponent((GUIComponent *)&x);
      std::__cxx11::string::~string((string *)(comp.Data + 3));
      std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
      std::__cxx11::istringstream::~istringstream
                ((istringstream *)(uniformName.field_2._M_local_buf + 8));
    }
    std::ifstream::close();
    path_local._7_1_ = true;
    line.field_2._8_4_ = 1;
    std::__cxx11::string::~string(local_258);
  }
  std::ifstream::~ifstream(local_228);
  return path_local._7_1_;
}

Assistant:

bool GUIComponentLoad(const std::string& path, std::vector<GUIComponent>& out_components) {
    std::ifstream file(path);
    
    if (!file.is_open()) {
        return false;
    }
    
    std::string line;
    while (std::getline(file, line)) {
        std::istringstream iss(line);
        std::string uniformName;
        std::string type;
        iss >> uniformName >> type;
        GUIComponent comp;
        if (type == "s1") {
            float value;
            iss >> value;
            comp.Type = EGUIComponentTypeSlider1;
            comp.UniformName = uniformName;
            comp.Data[0] = value;
        } else if (type == "s2") {
            float x, y;
            iss >> x >> y;
            comp.Type = EGUIComponentTypeSlider2;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
        } else if (type == "s3") {
            float x, y, z;
            iss >> x >> y >> z;
            comp.Type = EGUIComponentTypeSlider3;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
            comp.Data[2] = z;
        } else if (type == "s4") {
            float x, y, z, w;
            iss >> x >> y >> z >> w;
            comp.Type = EGUIComponentTypeSlider4;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
            comp.Data[2] = z;
            comp.Data[3] = w;
        } else if (type == "c3") {
            float x, y, z;
            iss >> x >> y >> z;
            comp.Type = EGUIComponentTypeColor3;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
            comp.Data[2] = z;
        } else if (type == "c4") {
            float x, y, z, w;
            iss >> x >> y >> z >> w;
            comp.Type = EGUIComponentTypeColor4;
            comp.UniformName = uniformName;
            comp.Data[0] = x;
            comp.Data[1] = y;
            comp.Data[2] = z;
            comp.Data[3] = w;
        }
        out_components.push_back(comp);
    }
    
    file.close();
    return true;
}